

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<std::error_code_(unsigned_long)> * __thiscall
testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times
          (TypedExpectation<std::error_code_(unsigned_long)> *this,int n)

{
  TypedExpectation<std::error_code_(unsigned_long)> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<std::error_code_(unsigned_long)> *pTStack_10;
  int n_local;
  TypedExpectation<std::error_code_(unsigned_long)> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }